

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O2

int __thiscall
sockpp::acceptor::accept(acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int s;
  sockaddr *__addr_00;
  int __protocol;
  int __type;
  socklen_t *__addr_len_00;
  undefined4 in_register_00000034;
  socket *psVar1;
  socklen_t len;
  result<int> res;
  socklen_t local_4c;
  result<int> local_48;
  socket local_30;
  
  __protocol = (int)__addr_len;
  if (__addr == (sockaddr *)0x0) {
    __addr_00 = (sockaddr *)0x0;
    __addr_len_00 = (socklen_t *)0x0;
    local_4c = 0;
  }
  else {
    __addr_00 = (sockaddr *)(**(code **)(*(long *)__addr + 0x18))(__addr);
    local_4c = (**(code **)(*(long *)__addr + 0x10))(__addr);
    __addr_len_00 = &local_4c;
  }
  s = ::accept(*(int *)(CONCAT44(in_register_00000034,__fd) + 8),__addr_00,__addr_len_00);
  socket::check_socket(&local_48,s);
  if (local_48.err_._M_value == 0) {
    local_30.handle_ = local_48.val_;
    local_30._vptr_socket = (_func_int **)&PTR__socket_0010dc58;
    psVar1 = &local_30;
    result<sockpp::stream_socket>::result
              ((result<sockpp::stream_socket> *)this,(stream_socket *)&local_30);
    socket::~socket(&local_30,(int)psVar1,__type,__protocol);
  }
  else {
    (this->super_socket).handle_ = -1;
    (this->super_socket)._vptr_socket = (_func_int **)&PTR__socket_0010dc58;
    this[1].super_socket._vptr_socket =
         (_func_int **)CONCAT44(local_48.err_._4_4_,local_48.err_._M_value);
    *(error_category **)&this[1].super_socket.handle_ = local_48.err_._M_cat;
  }
  return (int)this;
}

Assistant:

result<stream_socket> acceptor::accept(sock_address* clientAddr /*=nullptr*/) noexcept {
    sockaddr* p = clientAddr ? clientAddr->sockaddr_ptr() : nullptr;
    socklen_t len = clientAddr ? clientAddr->size() : 0;

    if (auto res = check_socket(::accept(handle(), p, clientAddr ? &len : nullptr)); !res)
        return res.error();
    else
        return stream_socket{res.value()};
}